

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

char * Curl_printable_address(Curl_addrinfo *ai,char *buf,size_t bufsize)

{
  in6_addr *ipaddr6;
  sockaddr_in6 *sa6;
  in_addr *ipaddr4;
  sockaddr_in *sa4;
  size_t bufsize_local;
  char *buf_local;
  Curl_addrinfo *ai_local;
  
  if (ai->ai_family == 2) {
    ai_local = (Curl_addrinfo *)Curl_inet_ntop(ai->ai_family,ai->ai_addr->sa_data + 2,buf,bufsize);
  }
  else if (ai->ai_family == 10) {
    ai_local = (Curl_addrinfo *)Curl_inet_ntop(ai->ai_family,ai->ai_addr->sa_data + 6,buf,bufsize);
  }
  else {
    ai_local = (Curl_addrinfo *)0x0;
  }
  return (char *)ai_local;
}

Assistant:

const char *
Curl_printable_address(const Curl_addrinfo *ai, char *buf, size_t bufsize)
{
  const struct sockaddr_in *sa4;
  const struct in_addr *ipaddr4;
#ifdef ENABLE_IPV6
  const struct sockaddr_in6 *sa6;
  const struct in6_addr *ipaddr6;
#endif

  switch(ai->ai_family) {
    case AF_INET:
      sa4 = (const void *)ai->ai_addr;
      ipaddr4 = &sa4->sin_addr;
      return Curl_inet_ntop(ai->ai_family, (const void *)ipaddr4, buf,
                            bufsize);
#ifdef ENABLE_IPV6
    case AF_INET6:
      sa6 = (const void *)ai->ai_addr;
      ipaddr6 = &sa6->sin6_addr;
      return Curl_inet_ntop(ai->ai_family, (const void *)ipaddr6, buf,
                            bufsize);
#endif
    default:
      break;
  }
  return NULL;
}